

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall
SSTableCache::SSTableCache(SSTableCache *this,SSTableDic *dic,uint64_t timeStamp,string *_fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer ppVar4;
  undefined8 uVar5;
  undefined8 in_RAX;
  const_iterator __begin1;
  pointer __args;
  const_iterator __end1;
  uint32_t offset;
  undefined8 local_38;
  
  local_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header).minKey = 0;
  (this->header).maxKey = 0;
  (this->header).timeStamp = 0;
  (this->header).length = 0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BloomFilter::BloomFilter(&this->bloomFilter,dic);
  paVar1 = &(this->fileName).field_2;
  (this->fileName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_fileName->_M_dataplus)._M_p;
  paVar2 = &_fileName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&_fileName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fileName).field_2 + 8) = uVar5;
  }
  else {
    (this->fileName)._M_dataplus._M_p = pcVar3;
    (this->fileName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->fileName)._M_string_length = _fileName->_M_string_length;
  (_fileName->_M_dataplus)._M_p = (pointer)paVar2;
  _fileName->_M_string_length = 0;
  (_fileName->field_2)._M_local_buf[0] = '\0';
  __args = (dic->
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (dic->
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->header).length = ((long)ppVar4 - (long)__args >> 3) * -0x3333333333333333;
  (this->header).minKey = __args->first;
  (this->header).maxKey = ppVar4[-1].first;
  (this->header).timeStamp = timeStamp;
  local_38._0_4_ = 0;
  for (; ppVar4 != __args; __args = __args + 1) {
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long_const&,unsigned_int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,&__args->first,(uint *)&local_38);
    local_38._0_4_ = (uint)local_38 + (int)(__args->second)._M_string_length;
  }
  local_38 = (ulong)(uint)local_38;
  std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
  emplace_back<int,unsigned_int&>
            ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
             &this->index,(int *)((long)&local_38 + 4),(uint *)&local_38);
  return;
}

Assistant:

SSTableCache::SSTableCache(const SSTableDic &dic, uint64_t timeStamp,
                           string _fileName)
    : bloomFilter(dic), fileName(std::move(_fileName)) {
  header.length = dic.size();
  header.minKey = dic.front().first;
  header.maxKey = dic.back().first;
  header.timeStamp = timeStamp;

  uint32_t offset = 0;
  for (const auto &pair : dic) {
    index.emplace_back(pair.first, offset);
    offset += pair.second.size();
  }
  index.emplace_back(0, offset);
}